

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::dense_hashtable(dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *this,size_type expected_max_items_in_table,Hasher *hf,Hasher *eql,Identity *ext,
                 SetKey *set,Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *alloc)

{
  sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *this_00;
  Hasher *in_RCX;
  long in_RSI;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  Identity *in_R8;
  SetKey *in_R9;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *in_stack_00000008;
  hasher *in_stack_ffffffffffffff78;
  Settings *in_stack_ffffffffffffff80;
  size_type local_68;
  size_type in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *in_stack_ffffffffffffffc0;
  
  Settings::Settings(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  KeyInfo::KeyInfo(&in_RDI->key_info,in_R8,in_R9,in_RCX);
  in_RDI->num_deleted = 0;
  in_RDI->num_elements = 0;
  if (in_RSI == 0) {
    local_68 = 0x20;
  }
  else {
    local_68 = sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
               min_buckets(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
  }
  in_RDI->num_buckets = local_68;
  alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::alloc_impl
            ((alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_> *)
             &stack0xffffffffffffffc0,in_stack_00000008);
  ValInfo::ValInfo(&in_RDI->val_info,
                   (alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_> *)
                   &stack0xffffffffffffffc0);
  alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::~alloc_impl
            ((alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_> *)0xa76b3b);
  in_RDI->table = (pointer)0x0;
  this_00 = (sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)bucket_count(in_RDI);
  sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
  reset_thresholds(this_00,(size_type)in_RDI);
  return;
}

Assistant:

explicit dense_hashtable(size_type expected_max_items_in_table = 0,
                           const HashFcn& hf = HashFcn(),
                           const EqualKey& eql = EqualKey(),
                           const ExtractKey& ext = ExtractKey(),
                           const SetKey& set = SetKey(),
                           const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        num_elements(0),
        num_buckets(expected_max_items_in_table == 0
                        ? HT_DEFAULT_STARTING_BUCKETS
                        : settings.min_buckets(expected_max_items_in_table, 0)),
        val_info(alloc_impl<value_alloc_type>(alloc)),
        table(NULL) {
    // table is NULL until emptyval is set.  However, we set num_buckets
    // here so we know how much space to allocate once emptyval is set
    settings.reset_thresholds(bucket_count());
  }